

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void add256(uint16_t *out,uint16_t *a,uint16_t *b)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = 0;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    uVar2 = (uint)b[lVar1] + uVar2 + a[lVar1];
    out[lVar1] = (uint16_t)uVar2;
    uVar2 = uVar2 >> 0x10;
  }
  return;
}

Assistant:

static void add256(uint16_t* out, const uint16_t* a, const uint16_t* b) {
    int i;
    uint32_t carry = 0;
    for (i = 0; i < 16; ++i) {
        carry += a[i];
        carry += b[i];
        out[i] = carry;
        carry >>= 16;
    }
}